

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

value_type * __thiscall
poplar::
map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_64UL>_>
::find(map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_64UL>_>
       *this,char_range key)

{
  bool bVar1;
  undefined8 uVar2;
  uint64_t uVar3;
  type *node_id_00;
  type_conflict *symb;
  const_reference pvVar4;
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  compact_bonsai_nlm<int,_64UL> *in_RDI;
  pair<const_int_*,_unsigned_long> pVar5;
  type_conflict *match;
  type *vptr;
  uint64_t node_id;
  undefined7 in_stack_ffffffffffffff48;
  uint8_t in_stack_ffffffffffffff4f;
  exception *in_stack_ffffffffffffff50;
  value_type *local_88;
  compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *this_00;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar6;
  uint64_t in_stack_ffffffffffffffd8;
  compact_bonsai_nlm<int,_64UL> *this_01;
  char_range local_18;
  
  this_01 = in_RDI;
  local_18.begin = in_RSI;
  local_18.end = in_RDX;
  bVar1 = char_range::empty(&local_18);
  uVar6 = 0;
  if (bVar1) {
    uVar2 = __cxa_allocate_exception(0x10);
    exception::exception
              (in_stack_ffffffffffffff50,
               (char *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    __cxa_throw(uVar2,&exception::typeinfo,exception::~exception);
  }
  if (local_18.end[-1] != '\0') {
    uVar2 = __cxa_allocate_exception(0x10);
    exception::exception
              (in_stack_ffffffffffffff50,
               (char *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    __cxa_throw(uVar2,&exception::typeinfo,exception::~exception);
  }
  if ((((ulong)(in_RDI->ptrs_).
               super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start & 1) == 0) ||
     (uVar3 = compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
              ::size((compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                      *)&(in_RDI->ptrs_).
                         super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage), uVar3 == 0)) {
    return (value_type *)0x0;
  }
  compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  ::get_root((compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
              *)&(in_RDI->ptrs_).
                 super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    bVar1 = char_range::empty(&local_18);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pVar5 = compact_bonsai_nlm<int,_64UL>::compare
                        (this_01,in_stack_ffffffffffffffd8,
                         (char_range *)CONCAT17(uVar6,in_stack_ffffffffffffffd0));
      local_88 = pVar5.first;
      return local_88;
    }
    pVar5 = compact_bonsai_nlm<int,_64UL>::compare
                      (this_01,in_stack_ffffffffffffffd8,
                       (char_range *)CONCAT17(uVar6,in_stack_ffffffffffffffd0));
    node_id_00 = std::get<0ul,int_const*,unsigned_long>
                           ((pair<const_int_*,_unsigned_long> *)0x219a01);
    symb = std::get<1ul,int_const*,unsigned_long>((pair<const_int_*,_unsigned_long> *)0x219a10);
    if (*node_id_00 != (type)0x0) {
      return *node_id_00;
    }
    local_18.begin = local_18.begin + *symb;
    while (this_00 = (compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                      *)pVar5.first,
          (in_RDI->ptrs_).
          super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish <= (pointer)*symb) {
      uVar3 = compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
              ::find_child(this_00,(uint64_t)node_id_00,(uint64_t)symb);
      if (uVar3 == 0xffffffffffffffff) {
        return (value_type *)0x0;
      }
      *symb = *symb - (long)(in_RDI->ptrs_).
                            super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
    }
    pvVar4 = std::array<unsigned_char,_256UL>::operator[]
                       ((array<unsigned_char,_256UL> *)in_stack_ffffffffffffff50,
                        CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    if (*pvVar4 == 0xff) break;
    in_stack_ffffffffffffff50 =
         (exception *)
         &(in_RDI->ptrs_).
          super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    make_symb_((map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_64UL>_>
                *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4f,0x219b1d);
    uVar3 = compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
            ::find_child(this_00,(uint64_t)node_id_00,(uint64_t)symb);
    if (uVar3 == 0xffffffffffffffff) {
      return (value_type *)0x0;
    }
    local_18.begin = local_18.begin + 1;
  }
  return (value_type *)0x0;
}

Assistant:

const value_type* find(char_range key) const {
        POPLAR_THROW_IF(key.empty(), "key must be a non-empty string.");
        POPLAR_THROW_IF(*(key.end - 1) != '\0', "The last character of key must be the null terminator.");

        if (!is_ready_ or hash_trie_.size() == 0) {
            return nullptr;
        }

        auto node_id = hash_trie_.get_root();

        while (!key.empty()) {
            auto [vptr, match] = label_store_.compare(node_id, key);
            if (vptr != nullptr) {
                return vptr;
            }

            key.begin += match;

            while (lambda_ <= match) {
                node_id = hash_trie_.find_child(node_id, step_symb);
                if (node_id == nil_id) {
                    return nullptr;
                }
                match -= lambda_;
            }

            if (codes_[*key.begin] == UINT8_MAX) {
                // Detecting an useless character
                return nullptr;
            }

            node_id = hash_trie_.find_child(node_id, make_symb_(*key.begin, match));
            if (node_id == nil_id) {
                return nullptr;
            }

            ++key.begin;
        }

        return label_store_.compare(node_id, key).first;
    }